

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_server.cpp
# Opt level: O2

void __thiscall
miniros::ServiceServer::ServiceServer(ServiceServer *this,string *service,NodeHandle *node_handle)

{
  std::make_shared<miniros::ServiceServer::Impl>();
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_).
             super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<miniros::NodeHandle,miniros::NodeHandle_const&>
            ((NodeHandle *)&stack0xffffffffffffffd8);
  std::__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->impl_).
                super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

ServiceServer::ServiceServer(const std::string& service, const NodeHandle& node_handle)
: impl_(std::make_shared<Impl>())
{
  impl_->service_ = service;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
}